

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O1

void __thiscall
simplex_tree_insertion<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::test_method
          (simplex_tree_insertion<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_> *this)

{
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  Filtration_value *pFVar7;
  pointer pvVar8;
  Simplex_tree<Gudhi::Simplex_tree_options_default> *pSVar9;
  bool bVar10;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<unsigned_long> __l_10;
  typePairSimplexBool returnValue;
  typeSimplex eleventhSimplex;
  typeSimplex ninethSimplex;
  typeSimplex eighthSimplex;
  typeSimplex seventhSimplex;
  typeSimplex sixthSimplex;
  typeSimplex fifthSimplex;
  typeSimplex fourthSimplex;
  typeSimplex tenthSimplex;
  typeSimplex thirdSimplex;
  typeVectorVertex eleventhSimplexVector;
  typeSimplex secondSimplex;
  Simplex_tree<Gudhi::Simplex_tree_options_default> st;
  typeVectorVertex ninethSimplexVector;
  typeVectorVertex eighthSimplexVector;
  typeVectorVertex seventhSimplexVector;
  typeVectorVertex sixthSimplexVector;
  typeVectorVertex fifthSimplexVector;
  typeVectorVertex fourthSimplexVector;
  typeVectorVertex thirdSimplexVector;
  typeVectorVertex secondSimplexVector;
  typeVectorVertex firstSimplexVector;
  typeVectorVertex tenthSimplexVector;
  typeSimplex firstSimplex;
  undefined1 local_948 [16];
  undefined1 local_938 [40];
  undefined1 local_910 [32];
  undefined1 local_8f0 [32];
  undefined1 local_8d0 [32];
  undefined1 local_8b0 [32];
  undefined1 local_890 [32];
  undefined1 local_870 [32];
  undefined1 local_850 [32];
  undefined1 local_830 [32];
  undefined1 local_810 [8];
  Filtration_simplex_base local_808;
  shared_count sStack_800;
  undefined1 local_7f8 [32];
  undefined1 local_7d8 [16];
  __node_base_ptr local_7c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_7c0;
  pair<std::vector<int,_std::allocator<int>_>,_double> local_7a8;
  Simplex_tree<Gudhi::Simplex_tree_options_default> local_788;
  vector<int,_std::allocator<int>_> local_700;
  vector<int,_std::allocator<int>_> local_6e8;
  vector<int,_std::allocator<int>_> local_6d0;
  vector<int,_std::allocator<int>_> local_6b8;
  vector<int,_std::allocator<int>_> local_6a0;
  vector<int,_std::allocator<int>_> local_688;
  vector<int,_std::allocator<int>_> local_670;
  vector<int,_std::allocator<int>_> local_658;
  vector<int,_std::allocator<int>_> local_640;
  vector<int,_std::allocator<int>_> local_628;
  pair<std::vector<int,_std::allocator<int>_>,_double> local_610;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_5f0;
  pointer local_5d8;
  Simplex_handle local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  unsigned_long local_48 [3];
  
  dim_max = -1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "********************************************************************",0x44);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"TEST OF INSERTION",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_788.nodes_label_to_list_._M_h._M_buckets =
       &local_788.nodes_label_to_list_._M_h._M_single_bucket;
  local_788.nodes_label_to_list_._M_h._M_bucket_count = 1;
  local_788.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_788.nodes_label_to_list_._M_h._M_element_count = 0;
  local_788.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_788.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  local_788.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_788.null_vertex_ = -1;
  local_788.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  local_788.root_.parent_ = -1;
  local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  local_788.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_788.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_788.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_788.dimension_ = -1;
  local_788.dimension_to_be_lowered_ = false;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - INSERT 0",0xd);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_ << 0x20);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_610;
  std::vector<int,_std::allocator<int>_>::vector(&local_640,__l,(allocator_type *)&local_7a8);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0xd3);
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start._1_7_,
                               (long)local_640.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                               (long)local_640.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start == 4);
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_610.second = (double)local_7f8;
  local_7f8._0_8_ = "firstSimplexVector.size() == 1";
  local_7f8._8_8_ = "";
  local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001ce6b8;
  local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&local_610.first,&local_640);
  local_610.second = 0.1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_948,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)&local_610);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),&local_610.second);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0xd9);
  local_7f8._8_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  local_7f8._16_8_ = (_Hash_node_base *)0x0;
  local_850._0_8_ = "st.num_vertices() == (size_t) 1";
  local_850._8_8_ = "";
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001ce6b8;
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_a0 = "";
  local_7a8.second = (double)local_850;
  local_7f8[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 1);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_7f8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - INSERT 1",0xd);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_7a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_658,__l_00,(allocator_type *)local_7f8);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0xde);
  local_7f8[0] = (allocator_type)
                 ((long)local_658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 4);
  local_7f8._8_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  local_7f8._16_8_ = (_Hash_node_base *)0x0;
  local_850._0_8_ = "secondSimplexVector.size() == 1";
  local_850._8_8_ = "";
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001ce6b8;
  local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_d0 = "";
  local_7a8.second = (double)local_850;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_7f8 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector(&local_7a8.first,&local_658);
  local_7a8.second = 0.1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_7f8,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)&local_7a8);
  local_948._0_8_ = local_7f8._0_8_;
  local_948[8] = (bool)local_7f8[8];
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),&local_7a8.second);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0xe4);
  local_850._8_8_ = (pointer)0x0;
  local_850._16_8_ = (_Hash_node_base *)0x0;
  local_870._0_8_ = "st.num_vertices() == (size_t) 2";
  local_870._8_8_ = "";
  local_7f8._8_8_ = local_7f8._8_8_ & 0xffffffffffffff00;
  local_7f8._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_7f8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_100 = "";
  local_7f8._24_8_ = (pointer)local_870;
  local_850[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 2);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_850 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - INSERT (0,1)",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_7f8._0_8_ = &DAT_100000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_7f8;
  std::vector<int,_std::allocator<int>_>::vector(&local_670,__l_01,(allocator_type *)local_850);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0xe9);
  local_850[0] = (allocator_type)
                 ((long)local_670.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_670.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 8);
  local_850._8_8_ = (pointer)0x0;
  local_850._16_8_ = (_Hash_node_base *)0x0;
  local_870._0_8_ = "thirdSimplexVector.size() == 2";
  local_870._8_8_ = "";
  local_7f8._8_8_ = local_7f8._8_8_ & 0xffffffffffffff00;
  local_7f8._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_7f8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_130 = "";
  local_7f8._24_8_ = (pointer)local_870;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_850 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_7f8,&local_670);
  local_7f8._24_8_ = (pointer)0x3fc999999999999a;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_850,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_7f8);
  local_948._0_8_ = local_850._0_8_;
  local_948[8] = (bool)local_850[8];
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_670.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_670.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),(double *)(local_7f8 + 0x18)
            );
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0xef);
  local_870._8_8_ = (pointer)0x0;
  local_870._16_8_ = (_Hash_node_base *)0x0;
  local_890._0_8_ = "st.num_vertices() == (size_t) 2";
  local_890._8_8_ = "";
  local_850._8_8_ = local_850._8_8_ & 0xffffffffffffff00;
  local_850._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_850._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_160 = "";
  local_850._24_8_ = (pointer)local_890;
  local_870[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 2);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_870 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - INSERT 2",0xd);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_850._0_4_ = 2;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_850;
  std::vector<int,_std::allocator<int>_>::vector(&local_688,__l_02,(allocator_type *)local_870);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0xf4);
  local_870[0] = (allocator_type)
                 ((long)local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 4);
  local_870._8_8_ = (pointer)0x0;
  local_870._16_8_ = (_Hash_node_base *)0x0;
  local_890._0_8_ = "fourthSimplexVector.size() == 1";
  local_890._8_8_ = "";
  local_850._8_8_ = local_850._8_8_ & 0xffffffffffffff00;
  local_850._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_850._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_190 = "";
  local_850._24_8_ = (pointer)local_890;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_870 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_850,&local_688);
  local_850._24_8_ = (pointer)0x3fb999999999999a;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_870,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_850);
  local_948._0_8_ = local_870._0_8_;
  local_948[8] = (bool)local_870[8];
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),(double *)(local_850 + 0x18)
            );
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0xfa);
  local_890._8_8_ = (pointer)0x0;
  local_890._16_8_ = (_Hash_node_base *)0x0;
  local_8b0._0_8_ = "st.num_vertices() == (size_t) 3";
  local_8b0._8_8_ = "";
  local_870._8_8_ = local_870._8_8_ & 0xffffffffffffff00;
  local_870._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_870._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1c0 = "";
  local_870._24_8_ = (pointer)local_8b0;
  local_890[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 3);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_890 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - INSERT (2,0)",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_870._0_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x2;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_870;
  std::vector<int,_std::allocator<int>_>::vector(&local_6a0,__l_03,(allocator_type *)local_890);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0xff);
  local_890[0] = (allocator_type)
                 ((long)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 8);
  local_890._8_8_ = (pointer)0x0;
  local_890._16_8_ = (_Hash_node_base *)0x0;
  local_8b0._0_8_ = "fifthSimplexVector.size() == 2";
  local_8b0._8_8_ = "";
  local_870._8_8_ = local_870._8_8_ & 0xffffffffffffff00;
  local_870._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_870._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1f0 = "";
  local_870._24_8_ = (pointer)local_8b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_890 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_870,&local_6a0);
  local_870._24_8_ = (pointer)0x3fc999999999999a;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_890,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_870);
  local_948._0_8_ = local_890._0_8_;
  local_948[8] = (bool)local_890[8];
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),(double *)(local_870 + 0x18)
            );
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x105);
  local_8b0._8_8_ = (pointer)0x0;
  local_8b0._16_8_ = (_Hash_node_base *)0x0;
  local_8d0._0_8_ = "st.num_vertices() == (size_t) 3";
  local_8d0._8_8_ = "";
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_890._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_220 = "";
  local_890._24_8_ = (pointer)local_8d0;
  local_8b0[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 3);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_8b0 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - INSERT (2,1)",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_890._0_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x100000002;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_890;
  std::vector<int,_std::allocator<int>_>::vector(&local_6b8,__l_04,(allocator_type *)local_8b0);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x10a);
  local_8b0[0] = (allocator_type)
                 ((long)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 8);
  local_8b0._8_8_ = (pointer)0x0;
  local_8b0._16_8_ = (_Hash_node_base *)0x0;
  local_8d0._0_8_ = "sixthSimplexVector.size() == 2";
  local_8d0._8_8_ = "";
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_890._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_250 = "";
  local_890._24_8_ = (pointer)local_8d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_8b0 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_890,&local_6b8);
  local_890._24_8_ = (pointer)0x3fc999999999999a;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_8b0,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_890);
  local_948._0_8_ = local_8b0._0_8_;
  local_948[8] = (bool)local_8b0[8];
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),(double *)(local_890 + 0x18)
            );
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x110);
  local_8d0._8_8_ = (pointer)0x0;
  local_8d0._16_8_ = (_Hash_node_base *)0x0;
  local_8f0._0_8_ = "st.num_vertices() == (size_t) 3";
  local_8f0._8_8_ = "";
  local_8b0._8_8_ = local_8b0._8_8_ & 0xffffffffffffff00;
  local_8b0._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_8b0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_280 = "";
  local_8b0._24_8_ = (pointer)local_8f0;
  local_8d0[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 3);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_8d0 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"   - INSERT (2,1,0)",0x13);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_8b0._0_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x100000002;
  local_8b0._8_8_ = local_8b0._8_8_ & 0xffffffff00000000;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)local_8b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_6d0,__l_05,(allocator_type *)local_8d0);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x115);
  local_8d0[0] = (allocator_type)
                 ((long)local_6d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_6d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 0xc);
  local_8d0._8_8_ = (pointer)0x0;
  local_8d0._16_8_ = (_Hash_node_base *)0x0;
  local_8f0._0_8_ = "seventhSimplexVector.size() == 3";
  local_8f0._8_8_ = "";
  local_8b0._8_8_ = local_8b0._8_8_ & 0xffffffffffffff00;
  local_8b0._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_8b0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2b0 = "";
  local_8b0._24_8_ = (pointer)local_8f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_8d0 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_8b0,&local_6d0);
  local_8b0._24_8_ = (pointer)0x3fd3333333333333;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_8d0,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_8b0);
  local_948._0_8_ = local_8d0._0_8_;
  local_948[8] = (bool)local_8d0[8];
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_6d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_6d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),(double *)(local_8b0 + 0x18)
            );
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c8,0x11b);
  local_8f0._8_8_ = (pointer)0x0;
  local_8f0._16_8_ = (_Hash_node_base *)0x0;
  local_830._0_8_ = "st.num_vertices() == (size_t) 3";
  local_830._8_8_ = "";
  local_8d0._8_8_ = local_8d0._8_8_ & 0xffffffffffffff00;
  local_8d0._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_8d0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2e0 = "";
  local_8d0._24_8_ = local_830;
  local_8f0[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 3);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_8f0 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - INSERT 3",0xd);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_8d0._0_4_ = 3;
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)local_8d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_6e8,__l_06,(allocator_type *)local_8f0);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x120);
  local_8f0[0] = (allocator_type)
                 ((long)local_6e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_6e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 4);
  local_8f0._8_8_ = (pointer)0x0;
  local_8f0._16_8_ = (_Hash_node_base *)0x0;
  local_830._0_8_ = "eighthSimplexVector.size() == 1";
  local_830._8_8_ = "";
  local_8d0._8_8_ = local_8d0._8_8_ & 0xffffffffffffff00;
  local_8d0._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_8d0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_310 = "";
  local_8d0._24_8_ = local_830;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_8f0 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_8d0,&local_6e8);
  local_8d0._24_8_ = 0.1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_8f0,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_8d0);
  local_948._0_8_ = local_8f0._0_8_;
  local_948[8] = (bool)local_8f0[8];
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_6e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_6e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),(double *)(local_8d0 + 0x18)
            );
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x126);
  local_830._8_8_ = (pointer)0x0;
  local_830._16_8_ = (pointer)0x0;
  local_910._0_8_ = "st.num_vertices() == (size_t) 4";
  local_910._8_8_ = "";
  local_8f0._8_8_ = local_8f0._8_8_ & 0xffffffffffffff00;
  local_8f0._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_8f0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_340 = "";
  local_8f0._24_8_ = (pointer)local_910;
  local_830[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 4);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_830 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - INSERT (3,0)",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_8f0._0_8_ = (__buckets_ptr)0x3;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_8f0;
  std::vector<int,_std::allocator<int>_>::vector(&local_700,__l_07,(allocator_type *)local_830);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_358,299);
  local_830[0] = (allocator_type)
                 ((long)local_700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 8);
  local_830._8_8_ = (pointer)0x0;
  local_830._16_8_ = (pointer)0x0;
  local_910._0_8_ = "ninethSimplexVector.size() == 2";
  local_910._8_8_ = "";
  local_8f0._8_8_ = local_8f0._8_8_ & 0xffffffffffffff00;
  local_8f0._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_8f0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_370 = "";
  local_8f0._24_8_ = (pointer)local_910;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_830 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_8f0,&local_700);
  local_8f0._24_8_ = (pointer)0x3fc999999999999a;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_830,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_8f0);
  local_948._0_8_ = local_830._0_8_;
  local_948[8] = (bool)local_830[8];
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            ((pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
              *)local_948);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&local_788,
             (int)((ulong)((long)local_700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2),(double *)(local_8f0 + 0x18)
            );
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_388,0x131);
  local_910._8_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  local_910._16_8_ = (_Hash_node_base *)0x0;
  local_938._0_8_ = "st.num_vertices() == (size_t) 4";
  local_938._8_8_ = "";
  local_830._8_8_ = local_830._8_8_ & 0xffffffffffffff00;
  local_830._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_830._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3a0 = "";
  local_830._24_8_ = (pointer)local_938;
  local_910[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 4);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_910 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"   - INSERT 0 (already inserted)",0x20);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_830._0_8_ = local_830._0_8_ & 0xffffffff00000000;
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)local_830;
  std::vector<int,_std::allocator<int>_>::vector(&local_628,__l_08,(allocator_type *)local_910);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b8,0x136);
  local_910[0] = (allocator_type)
                 ((long)local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 4);
  local_910._8_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  local_910._16_8_ = (_Hash_node_base *)0x0;
  local_938._0_8_ = "tenthSimplexVector.size() == 1";
  local_938._8_8_ = "";
  local_830._8_8_ = local_830._8_8_ & 0xffffffffffffff00;
  local_830._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_830._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3d0 = "";
  local_830._24_8_ = (pointer)local_938;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_910 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_830,&local_628);
  local_830._24_8_ = (pointer)0x3fd999999999999a;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_910,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_830);
  local_948._0_8_ = local_910._0_8_;
  local_948[8] = (bool)local_910[8];
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e8,0x13b);
  local_938._0_8_ = CONCAT71(local_938._1_7_,local_948[8]) ^ 1;
  local_938._8_8_ = 0;
  local_938._16_8_ = (_Hash_node_base *)0x0;
  local_7d8._0_8_ = "returnValue.second == false";
  local_7d8._8_8_ = (long)"returnValue.second == false" + 0x1b;
  local_910._8_8_ = local_910._8_8_ & 0xffffffffffffff00;
  local_910._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_910._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_400 = "";
  local_910._24_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)local_7d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_938 + 0x10));
  uVar2 = local_948._0_8_;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_418,0x13e);
  local_938._8_8_ = 0;
  local_938._16_8_ = (_Hash_node_base *)0x0;
  local_7d8._0_8_ = "shReturned == typeST::null_simplex()";
  local_7d8._8_8_ = (long)"shReturned == typeST::null_simplex()" + 0x24;
  local_910._8_8_ = local_910._8_8_ & 0xffffffffffffff00;
  local_910._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_910._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_430 = "";
  local_910._24_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)local_7d8;
  local_938[0] = (allocator_type)
                 ((pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                   *)uVar2 ==
                 (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                  *)0x0);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_938 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"st.num_vertices()=",0x12);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_448,0x140);
  local_938[0] = (allocator_type)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 4);
  local_938._8_8_ = 0;
  local_938._16_8_ = (_Hash_node_base *)0x0;
  local_7d8._0_8_ = "st.num_vertices() == (size_t) 4";
  local_7d8._8_8_ = (long)"st.num_vertices() == (size_t) 4" + 0x1f;
  local_910._8_8_ = local_910._8_8_ & 0xffffffffffffff00;
  local_910._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_910._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_460 = "";
  local_910._24_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)local_7d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_938 + 0x10));
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_478,0x141);
  if (local_788.dimension_to_be_lowered_ == true) {
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::lower_upper_bound_dimension
              (&local_788);
  }
  local_938._8_8_ = 0;
  local_938._16_8_ = (_Hash_node_base *)0x0;
  local_7d8._0_8_ = "st.dimension() == dim_max";
  local_7d8._8_8_ = (long)"st.dimension() == dim_max" + 0x19;
  local_910._8_8_ = local_910._8_8_ & 0xffffffffffffff00;
  local_910._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_910._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_490 = "";
  local_910._24_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)local_7d8;
  local_938[0] = (allocator_type)(local_788.dimension_ == dim_max);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_938 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"   - INSERT (2,1,0) (already inserted)",0x26);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  local_910._0_8_ =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x100000002;
  local_910._8_8_ = local_910._8_8_ & 0xffffffff00000000;
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_910;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_7d8,__l_09,(allocator_type *)local_938);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a8,0x146);
  local_938[0] = (allocator_type)(local_7d8._8_8_ - local_7d8._0_8_ == 0xc);
  local_938._8_8_ = 0;
  local_938._16_8_ = (_Hash_node_base *)0x0;
  local_910._24_8_ = local_810;
  local_810 = (undefined1  [8])0x19b2b4;
  local_808.filt_ = (Filtration_value)((long)"eleventhSimplexVector.size() == 3" + 0x21);
  local_910._8_8_ = local_910._8_8_ & 0xffffffffffffff00;
  local_910._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_910._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_4c0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)(local_938 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_910,
             (vector<int,_std::allocator<int>_> *)local_7d8);
  local_910._24_8_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x3fd999999999999a;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_938,
             (vector<int,_std::allocator<int>_> *)&local_788,(Filtration_value *)local_910);
  local_948._0_8_ = local_938._0_8_;
  local_948[8] = (bool)local_938[8];
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d8,0x14a);
  local_810 = (undefined1  [8])(CONCAT71(local_810._1_7_,local_948[8]) ^ 1);
  local_808.filt_ = 0.0;
  sStack_800.pi_ = (sp_counted_base *)0x0;
  local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x19b21f;
  local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x19b23a;
  local_938._8_8_ = local_938._8_8_ & 0xffffffffffffff00;
  local_938._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_938._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_4f0 = "";
  local_938._24_8_ = &local_7c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_800);
  uVar2 = local_948._0_8_;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_508,0x14d);
  local_808.filt_ = 0.0;
  sStack_800.pi_ = (sp_counted_base *)0x0;
  local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x19b23b;
  local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x19b25f;
  local_938._8_8_ = local_938._8_8_ & 0xffffffffffffff00;
  local_938._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_938._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_520 = "";
  local_938._24_8_ = &local_7c0;
  local_810[0] = (anon_class_1_0_00000001)
                 ((pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                   *)uVar2 ==
                 (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                  *)0x0);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_800);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_538,0x14e);
  local_810[0] = (anon_class_1_0_00000001)
                 (local_788.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 4);
  local_808.filt_ = 0.0;
  sStack_800.pi_ = (sp_counted_base *)0x0;
  local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x19b18d;
  local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x19b1ac;
  local_938._8_8_ = local_938._8_8_ & 0xffffffffffffff00;
  local_938._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_938._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_550 = "";
  local_938._24_8_ = &local_7c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_800);
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_568,0x14f);
  if (local_788.dimension_to_be_lowered_ == true) {
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::lower_upper_bound_dimension
              (&local_788);
  }
  local_810[0] = (anon_class_1_0_00000001)(local_788.dimension_ == dim_max);
  local_808.filt_ = 0.0;
  sStack_800.pi_ = (sp_counted_base *)0x0;
  local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x19b273;
  local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x19b28c;
  local_938._8_8_ = local_938._8_8_ & 0xffffffffffffff00;
  local_938._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_938._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_580 = "";
  local_938._24_8_ = &local_7c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_800);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_598,0x150);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension
            (&local_7c0,&local_788);
  local_48[0] = 4;
  local_48[1] = 4;
  local_48[2] = 1;
  __l_10._M_len = 3;
  __l_10._M_array = local_48;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_5f0,__l_10,(allocator_type *)(local_938 + 0x27));
  if ((long)local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_5f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_5f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar10 = true;
    }
    else {
      iVar4 = bcmp(local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_5f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar10 = iVar4 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  local_810[0] = (anon_class_1_0_00000001)bVar10;
  local_808.filt_ = 0.0;
  sStack_800.pi_ = (sp_counted_base *)0x0;
  local_938._24_8_ = &local_5b8;
  local_5b8 = "st.num_simplices_by_dimension() == std::vector<size_t>({4, 4, 1})";
  local_5b0 = "";
  local_938._8_8_ = local_938._8_8_ & 0xffffffffffffff00;
  local_938._0_8_ = &PTR__lazy_ostream_001ce6b8;
  local_938._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_5c0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_800);
  if (local_5f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_5f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)0x0) {
    operator_delete(local_7c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_7c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_7c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - first - 0",0x22);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,&local_610,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - second - 1",0x23);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,&local_7a8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - third - 4",0x22);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,(pair<std::vector<int,_std::allocator<int>_>,_double> *)local_7f8,4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - fourth - 2",0x23);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,(pair<std::vector<int,_std::allocator<int>_>,_double> *)local_850,2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - fifth - 5",0x22);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,(pair<std::vector<int,_std::allocator<int>_>,_double> *)local_870,5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - sixth - 6",0x22);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,(pair<std::vector<int,_std::allocator<int>_>,_double> *)local_890,6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - seventh - 8",0x24);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,(pair<std::vector<int,_std::allocator<int>_>,_double> *)local_8b0,8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - eighth - 3",0x23);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,(pair<std::vector<int,_std::allocator<int>_>,_double> *)local_8d0,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"simplex_tree_insertion - ninth - 7",0x22);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&local_788,(pair<std::vector<int,_std::allocator<int>_>,_double> *)local_8f0,7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"The complex contains ",0x15);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices
            (&local_788,&local_788.root_);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," simplices",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   - dimension ",0xf);
  if (local_788.dimension_to_be_lowered_ == true) {
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::lower_upper_bound_dimension
              (&local_788);
  }
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::clog,local_788.dimension_);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
  std::ostream::put('`');
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"Iterator on Simplices in the filtration, with [filtration value]:",0x41);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_788.filtration_vect_.
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_788.filtration_vect_.
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_938._0_8_ = &local_788;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
    initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>)_2_>
              (&local_788,(is_before_in_totally_ordered_filtration *)local_938,
               (anon_class_1_0_00000001 *)local_810);
  }
  local_5d8 = local_788.filtration_vect_.
              super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pvVar8 = local_788.filtration_vect_.
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_788.filtration_vect_.
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_788.filtration_vect_.
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ppVar1 = pvVar8->m_ptr;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"   ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"[",1);
      pFVar7 = (Filtration_value *)&ppVar1->second;
      if (ppVar1 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                     *)0x0) {
        pFVar7 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
                  Filtration_simplex_base_real::inf_;
      }
      poVar5 = std::ostream::_M_insert<double>
                         ((((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                             *)pFVar7)->super_Filtration_simplex_base).filt_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
      local_5d0.m_ptr = ppVar1;
      Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::simplex_vertex_range
                ((Simplex_vertex_range *)local_938,&local_788,&local_5d0);
      uVar2 = local_938._16_8_;
      uVar3 = local_938._24_4_;
      pSVar9 = (Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_938._0_8_;
      iVar4 = local_938._8_4_;
      if (local_938._8_4_ != local_938._24_4_ || local_938._0_8_ != local_938._16_8_) {
        do {
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          iVar4 = (int)(pSVar9->nodes_label_to_list_)._M_h._M_bucket_count;
          pSVar9 = (Simplex_tree<Gudhi::Simplex_tree_options_default> *)
                   (pSVar9->nodes_label_to_list_)._M_h._M_buckets;
        } while (iVar4 != uVar3 ||
                 pSVar9 != (Simplex_tree<Gudhi::Simplex_tree_options_default> *)uVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      pvVar8 = pvVar8 + 1;
    } while (pvVar8 != local_5d8);
  }
  if ((pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
       *)local_910._0_8_ !=
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
       *)0x0) {
    operator_delete((void *)local_910._0_8_,local_910._16_8_ - local_910._0_8_);
  }
  if ((pointer)local_7d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_7d8._0_8_,(long)local_7c8 - local_7d8._0_8_);
  }
  if ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)local_830._0_8_ !=
      (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)0x0) {
    operator_delete((void *)local_830._0_8_,local_830._16_8_ - local_830._0_8_);
  }
  if (local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_628.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((__buckets_ptr)local_8f0._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_8f0._0_8_,local_8f0._16_8_ - local_8f0._0_8_);
  }
  if (local_700.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_700.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)local_8d0._0_8_ !=
      (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)0x0) {
    operator_delete((void *)local_8d0._0_8_,local_8d0._16_8_ - local_8d0._0_8_);
  }
  if (local_6e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_6e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)local_8b0._0_8_ !=
      (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)0x0) {
    operator_delete((void *)local_8b0._0_8_,local_8b0._16_8_ - local_8b0._0_8_);
  }
  if (local_6d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_6d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)local_890._0_8_ !=
      (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)0x0) {
    operator_delete((void *)local_890._0_8_,local_890._16_8_ - local_890._0_8_);
  }
  if (local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)local_870._0_8_ !=
      (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)0x0) {
    operator_delete((void *)local_870._0_8_,local_870._16_8_ - local_870._0_8_);
  }
  if (local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)local_850._0_8_ !=
      (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
       *)0x0) {
    operator_delete((void *)local_850._0_8_,local_850._16_8_ - local_850._0_8_);
  }
  if (local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_688.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((Siblings *)local_7f8._0_8_ != (Siblings *)0x0) {
    operator_delete((void *)local_7f8._0_8_,local_7f8._16_8_ - local_7f8._0_8_);
  }
  if (local_670.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_670.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_670.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_670.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_7a8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_658.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_658.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((undefined **)
      local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (undefined **)0x0) {
    operator_delete(local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_610.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_640.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_640.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::~Simplex_tree(&local_788);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_insertion, typeST, list_of_tested_variants) {
  typedef typename typeST::Filtration_value Filtration_value;
  typedef std::pair<typename typeST::Simplex_handle, bool> typePairSimplexBool;
  typedef std::vector<typename typeST::Vertex_handle> typeVectorVertex;
  typedef std::pair<typeVectorVertex, Filtration_value> typeSimplex;
  const Filtration_value FIRST_FILTRATION_VALUE = 0.1;
  const Filtration_value SECOND_FILTRATION_VALUE = 0.2;
  const Filtration_value THIRD_FILTRATION_VALUE = 0.3;
  const Filtration_value FOURTH_FILTRATION_VALUE = 0.4;
  // reset since we run the test several times
  dim_max = -1;

  // TEST OF INSERTION
  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF INSERTION" << std::endl;
  typeST st;

  // ++ FIRST
  std::clog << "   - INSERT 0" << std::endl;
  typeVectorVertex firstSimplexVector{0};
  BOOST_CHECK(firstSimplexVector.size() == 1);
  typeSimplex firstSimplex = std::make_pair(firstSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  typePairSimplexBool returnValue = st.insert_simplex(firstSimplex.first, firstSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, firstSimplexVector.size(), firstSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 1);

  // ++ SECOND
  std::clog << "   - INSERT 1" << std::endl;
  typeVectorVertex secondSimplexVector{1};
  BOOST_CHECK(secondSimplexVector.size() == 1);
  typeSimplex secondSimplex = std::make_pair(secondSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(secondSimplex.first, secondSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, secondSimplexVector.size(), secondSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 2);

  // ++ THIRD
  std::clog << "   - INSERT (0,1)" << std::endl;
  typeVectorVertex thirdSimplexVector{0, 1};
  BOOST_CHECK(thirdSimplexVector.size() == 2);
  typeSimplex thirdSimplex = std::make_pair(thirdSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(thirdSimplex.first, thirdSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, thirdSimplexVector.size(), thirdSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 2); // Not incremented !!

  // ++ FOURTH
  std::clog << "   - INSERT 2" << std::endl;
  typeVectorVertex fourthSimplexVector{2};
  BOOST_CHECK(fourthSimplexVector.size() == 1);
  typeSimplex fourthSimplex = std::make_pair(fourthSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(fourthSimplex.first, fourthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, fourthSimplexVector.size(), fourthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3);

  // ++ FIFTH
  std::clog << "   - INSERT (2,0)" << std::endl;
  typeVectorVertex fifthSimplexVector{2, 0};
  BOOST_CHECK(fifthSimplexVector.size() == 2);
  typeSimplex fifthSimplex = std::make_pair(fifthSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(fifthSimplex.first, fifthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, fifthSimplexVector.size(), fifthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ SIXTH
  std::clog << "   - INSERT (2,1)" << std::endl;
  typeVectorVertex sixthSimplexVector{2, 1};
  BOOST_CHECK(sixthSimplexVector.size() == 2);
  typeSimplex sixthSimplex = std::make_pair(sixthSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(sixthSimplex.first, sixthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, sixthSimplexVector.size(), sixthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ SEVENTH
  std::clog << "   - INSERT (2,1,0)" << std::endl;
  typeVectorVertex seventhSimplexVector{2, 1, 0};
  BOOST_CHECK(seventhSimplexVector.size() == 3);
  typeSimplex seventhSimplex = std::make_pair(seventhSimplexVector, Filtration_value(THIRD_FILTRATION_VALUE));
  returnValue = st.insert_simplex(seventhSimplex.first, seventhSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, seventhSimplexVector.size(), seventhSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ EIGHTH
  std::clog << "   - INSERT 3" << std::endl;
  typeVectorVertex eighthSimplexVector{3};
  BOOST_CHECK(eighthSimplexVector.size() == 1);
  typeSimplex eighthSimplex = std::make_pair(eighthSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(eighthSimplex.first, eighthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, eighthSimplexVector.size(), eighthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 4);

  // ++ NINTH
  std::clog << "   - INSERT (3,0)" << std::endl;
  typeVectorVertex ninethSimplexVector{3, 0};
  BOOST_CHECK(ninethSimplexVector.size() == 2);
  typeSimplex ninethSimplex = std::make_pair(ninethSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(ninethSimplex.first, ninethSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, ninethSimplexVector.size(), ninethSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!

  // ++ TENTH
  std::clog << "   - INSERT 0 (already inserted)" << std::endl;
  typeVectorVertex tenthSimplexVector{0};
  BOOST_CHECK(tenthSimplexVector.size() == 1);
  // With a different filtration value
  typeSimplex tenthSimplex = std::make_pair(tenthSimplexVector, Filtration_value(FOURTH_FILTRATION_VALUE));
  returnValue = st.insert_simplex(tenthSimplex.first, tenthSimplex.second);

  BOOST_CHECK(returnValue.second == false);
  // Simplex_handle = boost::container::flat_map< typeST::Vertex_handle, Node >::iterator
  typename typeST::Simplex_handle shReturned = returnValue.first;
  BOOST_CHECK(shReturned == typeST::null_simplex());
  std::clog << "st.num_vertices()=" << st.num_vertices() << std::endl;
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!
  BOOST_CHECK(st.dimension() == dim_max);

  // ++ ELEVENTH
  std::clog << "   - INSERT (2,1,0) (already inserted)" << std::endl;
  typeVectorVertex eleventhSimplexVector{2, 1, 0};
  BOOST_CHECK(eleventhSimplexVector.size() == 3);
  typeSimplex eleventhSimplex = std::make_pair(eleventhSimplexVector, Filtration_value(FOURTH_FILTRATION_VALUE));
  returnValue = st.insert_simplex(eleventhSimplex.first, eleventhSimplex.second);

  BOOST_CHECK(returnValue.second == false);
  // Simplex_handle = boost::container::flat_map< typeST::Vertex_handle, Node >::iterator
  shReturned = returnValue.first;
  BOOST_CHECK(shReturned == typeST::null_simplex());
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!
  BOOST_CHECK(st.dimension() == dim_max);
  BOOST_CHECK(st.num_simplices_by_dimension() == std::vector<size_t>({4, 4, 1}));

  /* Inserted simplex:        */
  /*    1                     */
  /*    o                     */
  /*   /X\                    */
  /*  o---o---o               */
  /*  2   0   3               */

  //   [0.1] 0
  //   [0.1] 1
  //   [0.1] 2
  //   [0.1] 3
  //   [0.2] 1 0
  //   [0.2] 2 0
  //   [0.2] 2 1
  //   [0.2] 3 0
  //   [0.3] 2 1 0
  //  !! Be careful, simplex are sorted by filtration value on insertion !!
  std::clog << "simplex_tree_insertion - first - 0" << std::endl;
  test_simplex_tree_contains(st, firstSimplex, 0); // (0) -> 0
  std::clog << "simplex_tree_insertion - second - 1" << std::endl;
  test_simplex_tree_contains(st, secondSimplex, 1); // (1) -> 1
  std::clog << "simplex_tree_insertion - third - 4" << std::endl;
  test_simplex_tree_contains(st, thirdSimplex, 4); // (0,1) -> 4
  std::clog << "simplex_tree_insertion - fourth - 2" << std::endl;
  test_simplex_tree_contains(st, fourthSimplex, 2); // (2) -> 2
  std::clog << "simplex_tree_insertion - fifth - 5" << std::endl;
  test_simplex_tree_contains(st, fifthSimplex, 5); // (2,0) -> 5
  std::clog << "simplex_tree_insertion - sixth - 6" << std::endl;
  test_simplex_tree_contains(st, sixthSimplex, 6); //(2,1) -> 6
  std::clog << "simplex_tree_insertion - seventh - 8" << std::endl;
  test_simplex_tree_contains(st, seventhSimplex, 8); // (2,1,0) -> 8
  std::clog << "simplex_tree_insertion - eighth - 3" << std::endl;
  test_simplex_tree_contains(st, eighthSimplex, 3); // (3) -> 3
  std::clog << "simplex_tree_insertion - ninth - 7" << std::endl;
  test_simplex_tree_contains(st, ninethSimplex, 7); // (3,0) -> 7

  // Display the Simplex_tree - Can not be done in the middle of 2 inserts
  std::clog << "The complex contains " << st.num_simplices() << " simplices" << std::endl;
  std::clog << "   - dimension " << st.dimension() << std::endl;
  std::clog << std::endl << std::endl << "Iterator on Simplices in the filtration, with [filtration value]:" << std::endl;
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   " << "[" << st.filtration(f_simplex) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) {
      std::clog << (int) vertex << " ";
    }
    std::clog << std::endl;
  }

}